

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opt_dead_builtin_varyings.cpp
# Opt level: O2

ir_visitor_status __thiscall
anon_unknown.dwarf_1789cd::varying_info_visitor::visit(varying_info_visitor *this,ir_variable *var)

{
  int iVar1;
  
  if ((*(uint *)&var->data >> 0xc & (ir_var_mode_count|ir_var_shader_shared)) != this->mode) {
    return visit_continue;
  }
  if (this->find_frag_outputs == false) {
    iVar1 = (var->data).location;
    if (iVar1 == 0xe) {
      this->backcolor[1] = var;
    }
    else {
      if (iVar1 != 2) {
        if (iVar1 == 3) {
          this->fog = var;
          this->has_fog = true;
          return visit_continue;
        }
        if (iVar1 == 0xd) {
          this->backcolor[0] = var;
        }
        else {
          if (iVar1 != 1) {
            return visit_continue;
          }
          this->color[0] = var;
        }
        *(byte *)&this->color_usage = (byte)this->color_usage | 1;
        return visit_continue;
      }
      this->color[1] = var;
    }
    *(byte *)&this->color_usage = (byte)this->color_usage | 2;
    return visit_continue;
  }
  return visit_continue;
}

Assistant:

virtual ir_visitor_status visit(ir_variable *var)
   {
      if (var->data.mode != this->mode)
         return visit_continue;

      /* Nothing to do here for fragment outputs. */
      if (this->find_frag_outputs)
         return visit_continue;

      /* Handle colors and fog. */
      switch (var->data.location) {
      case VARYING_SLOT_COL0:
         this->color[0] = var;
         this->color_usage |= 1;
         break;
      case VARYING_SLOT_COL1:
         this->color[1] = var;
         this->color_usage |= 2;
         break;
      case VARYING_SLOT_BFC0:
         this->backcolor[0] = var;
         this->color_usage |= 1;
         break;
      case VARYING_SLOT_BFC1:
         this->backcolor[1] = var;
         this->color_usage |= 2;
         break;
      case VARYING_SLOT_FOGC:
         this->fog = var;
         this->has_fog = true;
         break;
      }

      return visit_continue;
   }